

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O2

void Abc_NtkSimulteBuggyMiter(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int *pModel;
  Abc_Obj_t *pAVar2;
  uint *__ptr;
  int *pModel_00;
  uint *__ptr_00;
  long lVar3;
  
  if (pNtk->vPis->nSize != 0x23) {
    __assert_fail("strlen(vPiValues1) == (unsigned)Abc_NtkPiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcVerify.c"
                  ,0x3fe,"void Abc_NtkSimulteBuggyMiter(Abc_Ntk_t *)");
  }
  if (pNtk->vPos->nSize == 1) {
    pModel = (int *)malloc((long)pNtk->vCis->nSize << 2);
    iVar1 = 0x23;
    for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
      Abc_NtkPi(pNtk,(int)lVar3);
      pModel[lVar3] = "01001011100000000011010110101000000"[lVar3] + -0x30;
      iVar1 = pNtk->vPis->nSize;
    }
    for (lVar3 = 0; (int)lVar3 < pNtk->vBoxes->nSize; lVar3 = lVar3 + 1) {
      pAVar2 = Abc_NtkBox(pNtk,(int)lVar3);
      if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8) {
        pModel[pNtk->vPis->nSize + lVar3] = (pAVar2->field_5).iData + -1;
      }
    }
    __ptr = (uint *)Abc_NtkVerifySimulatePattern(pNtk,pModel);
    printf("Value = %d\n",(ulong)*__ptr);
    pModel_00 = (int *)malloc((long)pNtk->vCis->nSize << 2);
    for (lVar3 = 0; lVar3 < pNtk->vPis->nSize; lVar3 = lVar3 + 1) {
      Abc_NtkPi(pNtk,(int)lVar3);
      pModel_00[lVar3] = "11001101011101011111110100100010001"[lVar3] + -0x30;
    }
    for (lVar3 = 0; (int)lVar3 < pNtk->vBoxes->nSize; lVar3 = lVar3 + 1) {
      pAVar2 = Abc_NtkBox(pNtk,(int)lVar3);
      if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8) {
        pModel_00[pNtk->vPis->nSize + lVar3] = __ptr[pNtk->vPos->nSize + lVar3];
      }
    }
    __ptr_00 = (uint *)Abc_NtkVerifySimulatePattern(pNtk,pModel_00);
    printf("Value = %d\n",(ulong)*__ptr_00);
    free(pModel);
    free(pModel_00);
    free(__ptr);
    free(__ptr_00);
    return;
  }
  __assert_fail("1 == Abc_NtkPoNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcVerify.c"
                ,0x3ff,"void Abc_NtkSimulteBuggyMiter(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkSimulteBuggyMiter( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    int * pModel1, * pModel2, * pResult1, * pResult2;
    char * vPiValues1 = "01001011100000000011010110101000000";
    char * vPiValues2 = "11001101011101011111110100100010001";

    assert( strlen(vPiValues1) == (unsigned)Abc_NtkPiNum(pNtk) );
    assert( 1 == Abc_NtkPoNum(pNtk) );

    pModel1 = ABC_ALLOC( int, Abc_NtkCiNum(pNtk) );
    Abc_NtkForEachPi( pNtk, pObj, i )
        pModel1[i] = vPiValues1[i] - '0';
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pModel1[Abc_NtkPiNum(pNtk)+i] = ((int)(ABC_PTRINT_T)pObj->pData) - 1;

    pResult1 = Abc_NtkVerifySimulatePattern( pNtk, pModel1 );
    printf( "Value = %d\n", pResult1[0] );

    pModel2 = ABC_ALLOC( int, Abc_NtkCiNum(pNtk) );
    Abc_NtkForEachPi( pNtk, pObj, i )
        pModel2[i] = vPiValues2[i] - '0';
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pModel2[Abc_NtkPiNum(pNtk)+i] = pResult1[Abc_NtkPoNum(pNtk)+i];

    pResult2 = Abc_NtkVerifySimulatePattern( pNtk, pModel2 );
    printf( "Value = %d\n", pResult2[0] );

    ABC_FREE( pModel1 );
    ABC_FREE( pModel2 );
    ABC_FREE( pResult1 );
    ABC_FREE( pResult2 );
}